

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arg.h
# Opt level: O1

void __thiscall TCLAP::Arg::trimFlag(Arg *this,string *flag,string *value)

{
  size_type sVar1;
  long *local_40 [2];
  long local_30 [2];
  
  if (flag->_M_string_length != 0) {
    sVar1 = 0;
    do {
      if ((flag->_M_dataplus)._M_p[sVar1] == delimiterRef()::delim) goto LAB_001149ef;
      sVar1 = sVar1 + 1;
    } while (flag->_M_string_length != sVar1);
  }
  sVar1 = 0;
LAB_001149ef:
  if (1 < (uint)sVar1) {
    std::__cxx11::string::substr((ulong)local_40,(ulong)flag);
    std::__cxx11::string::operator=((string *)value,(string *)local_40);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
    std::__cxx11::string::substr((ulong)local_40,(ulong)flag);
    std::__cxx11::string::operator=((string *)flag,(string *)local_40);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
  }
  return;
}

Assistant:

inline void Arg::trimFlag(std::string& flag, std::string& value) const
{
	int stop = 0;
	for ( int i = 0; static_cast<unsigned int>(i) < flag.length(); i++ )
		if ( flag[i] == Arg::delimiter() )
		{
			stop = i;
			break;
		}

	if ( stop > 1 )
	{
		value = flag.substr(stop+1);
		flag = flag.substr(0,stop);
	}

}